

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u32 uVar1;
  u8 *puVar2;
  u32 uVar3;
  ushort uVar4;
  u16 uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  ushort *puVar10;
  ushort uVar11;
  ulong uVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  u32 uVar20;
  u8 *local_70;
  uint local_64;
  u8 *local_50;
  
  puVar2 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar11 = pPage->cellOffset;
  uVar7 = pPage->nCell;
  uVar16 = (uint)uVar11 + (uint)uVar7 * 2;
  uVar1 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)puVar2[uVar12 + 7]) {
LAB_0017a5c2:
    local_64 = uVar1 - 4;
    uVar20 = uVar1;
    if ((ulong)uVar7 != 0) {
      uVar19 = 0;
      local_50 = (u8 *)0x0;
      local_70 = puVar2;
      uVar3 = uVar1;
      do {
        uVar4 = *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar11) << 8 |
                *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar11) >> 8;
        if ((uVar4 < uVar16) ||
           (uVar14 = (uint)uVar4, uVar14 != local_64 && (int)local_64 <= (int)(uint)uVar4)) {
          uVar13 = 0xfce4;
          goto LAB_0017a83e;
        }
        uVar5 = (*pPage->xCellSize)(pPage,local_70 + uVar14);
        uVar20 = uVar3 - uVar5;
        if (((int)uVar20 < (int)uVar16) || ((int)uVar1 < (int)((uint)uVar4 + (uint)uVar5))) {
          uVar13 = 0xfcea;
          goto LAB_0017a83e;
        }
        *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar11) = (ushort)uVar20 << 8 | (ushort)uVar20 >> 8
        ;
        if (local_50 == (u8 *)0x0) {
          if (uVar20 != uVar14) {
            local_70 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar4 = *(ushort *)(puVar2 + uVar12 + 5) << 8 | *(ushort *)(puVar2 + uVar12 + 5) >> 8;
            memcpy(local_70 + uVar4,puVar2 + uVar4,(long)(int)(uVar3 - uVar4));
            local_50 = local_70;
            goto LAB_0017a6c9;
          }
          local_50 = (u8 *)0x0;
        }
        else {
LAB_0017a6c9:
          memcpy(puVar2 + uVar20,local_70 + uVar14,(ulong)uVar5);
        }
        uVar19 = uVar19 + 1;
        uVar3 = uVar20;
      } while (uVar7 != uVar19);
    }
    puVar2[uVar12 + 7] = '\0';
  }
  else {
    uVar4 = *(ushort *)(puVar2 + uVar12 + 1) << 8 | *(ushort *)(puVar2 + uVar12 + 1) >> 8;
    if ((int)(uVar1 - 4) < (int)(uint)uVar4) {
      uVar13 = 0xfcb4;
      goto LAB_0017a83e;
    }
    uVar14 = (uint)uVar4;
    if (uVar4 == 0) goto LAB_0017a5c2;
    uVar6 = *(ushort *)(puVar2 + uVar4) << 8 | *(ushort *)(puVar2 + uVar4) >> 8;
    if (uVar1 - 4 < (uint)uVar6) {
      uVar13 = 0xfcb7;
      goto LAB_0017a83e;
    }
    if ((uVar6 != 0) && ((puVar2[uVar6] != '\0' || (puVar2[(ulong)uVar6 + 1] != '\0'))))
    goto LAB_0017a5c2;
    uVar7 = *(ushort *)(puVar2 + uVar12 + 5) << 8 | *(ushort *)(puVar2 + uVar12 + 5) >> 8;
    iVar15 = uVar14 - uVar7;
    if (uVar14 < uVar7 || iVar15 == 0) {
      uVar13 = 0xfcbf;
      goto LAB_0017a83e;
    }
    uVar8 = *(ushort *)(puVar2 + (ulong)uVar4 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar4 + 2) >> 8;
    uVar18 = (uint)uVar8;
    uVar9 = (uint)uVar8 + (uint)uVar4;
    if (uVar6 == 0) {
      uVar17 = 0;
      if ((int)uVar1 < (int)uVar9) {
        uVar13 = 0xfcc8;
        goto LAB_0017a83e;
      }
    }
    else {
      if (uVar6 < uVar9) {
        uVar13 = 0xfcc2;
        goto LAB_0017a83e;
      }
      uVar4 = *(ushort *)(puVar2 + (ulong)uVar6 + 2) << 8 |
              *(ushort *)(puVar2 + (ulong)uVar6 + 2) >> 8;
      uVar17 = (uint)uVar4;
      if ((int)uVar1 < (int)((uint)uVar4 + (uint)uVar6)) {
        uVar13 = 0xfcc4;
        goto LAB_0017a83e;
      }
      memmove(puVar2 + (uVar4 + uVar9),puVar2 + uVar9,(long)(int)(uVar6 - uVar9));
      uVar18 = (uint)uVar8 + (uint)uVar4;
    }
    uVar20 = uVar18 + uVar7;
    memmove(puVar2 + uVar20,puVar2 + uVar7,(long)iVar15);
    if (uVar11 < uVar16) {
      puVar10 = (ushort *)(puVar2 + uVar11);
      do {
        uVar11 = *puVar10 << 8 | *puVar10 >> 8;
        uVar9 = uVar18;
        if ((uVar11 < uVar14) || (uVar9 = uVar17, (uint)uVar11 < (uint)uVar6)) {
          uVar11 = uVar11 + (short)uVar9;
          *puVar10 = uVar11 * 0x100 | uVar11 >> 8;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 < puVar2 + uVar16);
    }
  }
  if ((uint)puVar2[uVar12 + 7] + (uVar20 - uVar16) == pPage->nFree) {
    *(ushort *)(puVar2 + uVar12 + 5) = (ushort)uVar20 << 8 | (ushort)uVar20 >> 8;
    (puVar2 + uVar12 + 1)[0] = '\0';
    (puVar2 + uVar12 + 1)[1] = '\0';
    memset(puVar2 + uVar16,0,(long)(int)(uVar20 - uVar16));
    return 0;
  }
  uVar13 = 0xfcff;
LAB_0017a83e:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar13,
              "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
  return 0xb;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}